

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model-loader.cpp
# Opt level: O3

bool __thiscall
llama_model_loader::load_all_data
          (llama_model_loader *this,ggml_context *ctx,llama_buf_map *bufs,llama_mlocks *lmlocks,
          llama_progress_callback progress_callback,void *progress_callback_user_data)

{
  ushort uVar1;
  pointer puVar2;
  pointer puVar3;
  pointer ppVar4;
  ulong uVar5;
  llama_mmap *this_00;
  undefined8 *puVar6;
  undefined8 *puVar7;
  undefined8 *puVar8;
  pointer pfVar9;
  bool bVar10;
  char cVar11;
  undefined8 in_RAX;
  _State_baseV2 *__tmp;
  long lVar12;
  long lVar13;
  long lVar14;
  undefined8 uVar15;
  undefined4 *puVar16;
  char *pcVar17;
  llama_tensor_weight *plVar18;
  _func_int **__new_size;
  const_iterator cVar19;
  iterator iVar20;
  void *pvVar21;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var22;
  _Result<std::pair<ggml_tensor_*,_bool>_> *p_Var23;
  size_t last;
  undefined8 uVar24;
  runtime_error *prVar25;
  undefined8 uVar26;
  pointer this_01;
  uint uVar27;
  ulong uVar28;
  _func_int **pp_Var29;
  ulong uVar30;
  _State_baseV2 *__tmp_1;
  pointer puVar31;
  ulong uVar32;
  undefined8 *puVar33;
  size_t sVar34;
  pair<ggml_tensor_*,_bool> pVar35;
  ggml_backend_buffer *buf;
  ggml_backend_dev_props props;
  vector<ggml_backend_event_*,_std::allocator<ggml_backend_event_*>_> events;
  vector<no_init<unsigned_char>,_std::allocator<no_init<unsigned_char>_>_> read_buf;
  vector<void_*,_std::allocator<void_*>_> host_ptrs;
  vector<ggml_backend_buffer_*,_std::allocator<ggml_backend_buffer_*>_> host_buffers;
  vector<std::future<std::pair<ggml_tensor_*,_bool>_>,_std::allocator<std::future<std::pair<ggml_tensor_*,_bool>_>_>_>
  validation_result;
  long *local_160;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_ggml_backend_buffer_*>,_std::allocator<std::pair<const_unsigned_int,_ggml_backend_buffer_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_158;
  ggml_backend_buffer *local_150 [2];
  undefined4 local_13c;
  string local_138;
  char local_114;
  char local_113;
  char local_111;
  __basic_future<std::pair<ggml_tensor_*,_bool>_> local_110;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_100;
  llama_progress_callback local_f8;
  long local_f0;
  undefined8 *local_e8;
  undefined8 *puStack_e0;
  long local_d8;
  vector<no_init<unsigned_char>,_std::allocator<no_init<unsigned_char>_>_> local_c8;
  void *local_a8;
  undefined8 uStack_a0;
  long local_98;
  undefined8 *local_88;
  undefined8 *puStack_80;
  long local_78;
  llama_mlocks *local_70;
  void *local_68;
  ggml_context *local_60;
  vector<std::future<std::pair<ggml_tensor_*,_bool>_>,_std::allocator<std::future<std::pair<ggml_tensor_*,_bool>_>_>_>
  local_58;
  long local_38;
  
  local_158 = &bufs->_M_h;
  local_f8 = progress_callback;
  local_70 = lmlocks;
  local_68 = progress_callback_user_data;
  local_60 = ctx;
  if (this->size_data == 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model-loader.cpp"
               ,0x37a,"GGML_ASSERT(%s) failed","size_data != 0 && \"call init_mappings() first\"");
  }
  local_c8.super__Vector_base<no_init<unsigned_char>,_std::allocator<no_init<unsigned_char>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.super__Vector_base<no_init<unsigned_char>,_std::allocator<no_init<unsigned_char>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar12 = 0;
  local_c8.super__Vector_base<no_init<unsigned_char>,_std::allocator<no_init<unsigned_char>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.
  super__Vector_base<std::future<std::pair<ggml_tensor_*,_bool>_>,_std::allocator<std::future<std::pair<ggml_tensor_*,_bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.
  super__Vector_base<std::future<std::pair<ggml_tensor_*,_bool>_>,_std::allocator<std::future<std::pair<ggml_tensor_*,_bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (future<std::pair<ggml_tensor_*,_bool>_> *)0x0;
  local_58.
  super__Vector_base<std::future<std::pair<ggml_tensor_*,_bool>_>,_std::allocator<std::future<std::pair<ggml_tensor_*,_bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (future<std::pair<ggml_tensor_*,_bool>_> *)0x0;
  local_78 = 0;
  local_88 = (undefined8 *)0x0;
  puStack_80 = (undefined8 *)0x0;
  local_d8 = 0;
  local_e8 = (undefined8 *)0x0;
  puStack_e0 = (undefined8 *)0x0;
  local_98 = 0;
  local_a8 = (void *)0x0;
  uStack_a0 = 0;
  local_13c = (undefined4)CONCAT71((int7)((ulong)in_RAX >> 8),1);
  if (this->use_mmap != false) goto LAB_001b78ea;
  if (this->check_tensors == false) {
    local_138._M_dataplus._M_p = local_138._M_dataplus._M_p & 0xffffffff00000000;
    cVar19 = std::
             _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_ggml_backend_buffer_*>,_std::allocator<std::pair<const_unsigned_int,_ggml_backend_buffer_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find(&bufs->_M_h,(key_type_conflict *)&local_138);
    if (cVar19.
        super__Node_iterator_base<std::pair<const_unsigned_int,_ggml_backend_buffer_*>,_false>.
        _M_cur != (__node_type *)0x0) {
      local_150[0] = (ggml_backend_buffer *)((ulong)local_150[0] & 0xffffffff00000000);
      iVar20 = std::
               _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_ggml_backend_buffer_*>,_std::allocator<std::pair<const_unsigned_int,_ggml_backend_buffer_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::find(local_158,(key_type_conflict *)local_150);
      if (iVar20.
          super__Node_iterator_base<std::pair<const_unsigned_int,_ggml_backend_buffer_*>,_false>.
          _M_cur == (__node_type *)0x0) {
        std::__throw_out_of_range("_Map_base::at");
      }
      if (*(long *)((long)iVar20.
                          super__Node_iterator_base<std::pair<const_unsigned_int,_ggml_backend_buffer_*>,_false>
                          ._M_cur + 0x10) != 0) {
        lVar12 = ggml_backend_buffer_get_type();
        lVar13 = ggml_backend_buft_get_device(lVar12);
        if (lVar13 == 0) {
          uVar26 = ggml_backend_buft_name(lVar12);
          lVar12 = 0;
          llama_log_internal(GGML_LOG_LEVEL_DEBUG,
                             "%s: no device found for buffer type %s for async uploads\n",
                             "load_all_data",uVar26);
          goto LAB_001b78ea;
        }
        lVar14 = ggml_backend_dev_buffer_type(lVar13);
        if (lVar12 != lVar14) {
          uVar26 = ggml_backend_buft_name(lVar12);
          uVar15 = ggml_backend_dev_name(lVar13);
          lVar12 = 0;
          llama_log_internal(GGML_LOG_LEVEL_DEBUG,
                             "%s: buffer type %s is not the default buffer type for device %s for async uploads\n"
                             ,"load_all_data",uVar26,uVar15);
          goto LAB_001b78ea;
        }
        ggml_backend_dev_get_props(lVar13,&local_138);
        if (((local_114 == '\x01') && (local_113 == '\x01')) && (local_111 != '\0')) {
          lVar12 = ggml_backend_dev_host_buffer_type(lVar13);
          if (lVar12 == 0) {
            uVar26 = ggml_backend_dev_name(lVar13);
            pcVar17 = "%s: no host buffer type found for device %s\n";
          }
          else {
            lVar14 = 4;
            do {
              local_150[0] = (ggml_backend_buffer *)ggml_backend_buft_alloc_buffer(lVar12,0x100000);
              if (local_150[0] == (ggml_backend_buffer *)0x0) {
                uVar26 = ggml_backend_dev_name(lVar13);
                llama_log_internal(GGML_LOG_LEVEL_DEBUG,
                                   "%s: failed to allocate host buffer for async uploads for device %s\n"
                                   ,"load_all_data",uVar26);
                goto LAB_001b781b;
              }
              std::vector<ggml_backend_buffer*,std::allocator<ggml_backend_buffer*>>::
              emplace_back<ggml_backend_buffer*&>
                        ((vector<ggml_backend_buffer*,std::allocator<ggml_backend_buffer*>> *)
                         &local_88,local_150);
              local_110._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr = (element_type *)ggml_backend_buffer_get_base(local_150[0]);
              std::vector<void*,std::allocator<void*>>::emplace_back<void*>
                        ((vector<void*,std::allocator<void*>> *)&local_a8,(void **)&local_110);
              local_110._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr = (element_type *)ggml_backend_event_new(lVar13);
              if (local_110._M_state.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr == (element_type *)0x0) {
                uVar26 = ggml_backend_dev_name(lVar13);
                llama_log_internal(GGML_LOG_LEVEL_DEBUG,
                                   "%s: failed to create event for async uploads for device %s\n",
                                   "load_all_data",uVar26);
                goto LAB_001b781b;
              }
              std::vector<ggml_backend_event*,std::allocator<ggml_backend_event*>>::
              emplace_back<ggml_backend_event*&>
                        ((vector<ggml_backend_event*,std::allocator<ggml_backend_event*>> *)
                         &local_e8,(ggml_backend_event **)&local_110);
              lVar14 = lVar14 + -1;
            } while (lVar14 != 0);
            lVar12 = ggml_backend_dev_init(lVar13,0);
            if (lVar12 != 0) {
              uVar26 = ggml_backend_get_device(lVar12);
              uVar26 = ggml_backend_dev_name(uVar26);
              local_138._M_dataplus._M_p = local_138._M_dataplus._M_p & 0xffffffff00000000;
              iVar20 = std::
                       _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_ggml_backend_buffer_*>,_std::allocator<std::pair<const_unsigned_int,_ggml_backend_buffer_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       ::find(local_158,(key_type_conflict *)&local_138);
              if (iVar20.
                  super__Node_iterator_base<std::pair<const_unsigned_int,_ggml_backend_buffer_*>,_false>
                  ._M_cur == (__node_type *)0x0) {
                std::__throw_out_of_range("_Map_base::at");
              }
              uVar15 = ggml_backend_buffer_get_type
                                 (*(undefined8 *)
                                   ((long)iVar20.
                                          super__Node_iterator_base<std::pair<const_unsigned_int,_ggml_backend_buffer_*>,_false>
                                          ._M_cur + 0x10));
              uVar15 = ggml_backend_buft_name(uVar15);
              uVar24 = ggml_backend_name(lVar12);
              llama_log_internal(GGML_LOG_LEVEL_DEBUG,
                                 "%s: using async uploads for device %s, buffer type %s, backend %s\n"
                                 ,"load_all_data",uVar26,uVar15,uVar24);
              local_13c = 0;
              goto LAB_001b78ea;
            }
            uVar26 = ggml_backend_dev_name(lVar13);
            pcVar17 = "%s: failed to initialize backend for device %s for async uploads\n";
          }
        }
        else {
          uVar26 = ggml_backend_dev_name(lVar13);
          pcVar17 = "%s: device %s does not support async, host buffers or events\n";
        }
        llama_log_internal(GGML_LOG_LEVEL_DEBUG,pcVar17,"load_all_data",uVar26);
        goto LAB_001b781b;
      }
    }
    lVar12 = 0;
    llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: no buffer found for async uploads\n",
                       "load_all_data");
  }
  else {
LAB_001b781b:
    lVar12 = 0;
  }
LAB_001b78ea:
  puVar16 = (undefined4 *)ggml_get_first_tensor(local_60);
  uVar32 = 0;
  local_f0 = lVar12;
  while (puVar7 = puStack_e0, puVar33 = local_e8, puVar16 != (undefined4 *)0x0) {
    pcVar17 = (char *)ggml_get_name(puVar16);
    plVar18 = get_weight(this,pcVar17);
    if (plVar18 != (llama_tensor_weight *)0x0) {
      if ((local_f8 != (llama_progress_callback)0x0) &&
         (bVar10 = (*local_f8)((float)this->size_done / (float)this->size_data,local_68), !bVar10))
      {
        bVar10 = false;
        goto LAB_001b8125;
      }
      __new_size = (_func_int **)ggml_nbytes(puVar16);
      uVar28 = (ulong)plVar18->idx;
      if (this->use_mmap == true) {
        puVar31 = (this->mappings).
                  super__Vector_base<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>,_std::allocator<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(this->mappings).
                          super__Vector_base<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>,_std::allocator<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)puVar31 >> 3) <= uVar28
           ) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar28);
        }
        local_138._M_dataplus._M_p._0_4_ = (uint)plVar18->idx;
        cVar19 = std::
                 _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_ggml_backend_buffer_*>,_std::allocator<std::pair<const_unsigned_int,_ggml_backend_buffer_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find(local_158,(key_type_conflict *)&local_138);
        if (cVar19.
            super__Node_iterator_base<std::pair<const_unsigned_int,_ggml_backend_buffer_*>,_false>.
            _M_cur == (__node_type *)0x0) {
          lVar12 = 0;
        }
        else {
          local_138._M_dataplus._M_p._0_4_ = (uint)plVar18->idx;
          iVar20 = std::
                   _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_ggml_backend_buffer_*>,_std::allocator<std::pair<const_unsigned_int,_ggml_backend_buffer_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find(local_158,(key_type_conflict *)&local_138);
          if (iVar20.
              super__Node_iterator_base<std::pair<const_unsigned_int,_ggml_backend_buffer_*>,_false>
              ._M_cur == (__node_type *)0x0) {
            std::__throw_out_of_range("_Map_base::at");
          }
          lVar12 = *(long *)((long)iVar20.
                                   super__Node_iterator_base<std::pair<const_unsigned_int,_ggml_backend_buffer_*>,_false>
                                   ._M_cur + 0x10);
        }
        pvVar21 = llama_mmap::addr((llama_mmap *)
                                   puVar31[uVar28]._M_t.
                                   super___uniq_ptr_impl<llama_mmap,_std::default_delete<llama_mmap>_>
                                   ._M_t);
        pp_Var29 = (_func_int **)((long)pvVar21 + plVar18->offs);
        if (this->check_tensors == true) {
          local_138._M_dataplus._M_p = (pointer)0x0;
          local_138._M_string_length = 0;
          local_38 = lVar12;
          p_Var22 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x60);
          p_Var22->_M_use_count = 1;
          p_Var22->_M_weak_count = 1;
          p_Var22->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00285e80;
          local_100 = p_Var22 + 1;
          p_Var22[1]._M_use_count = 0;
          p_Var22[1]._M_weak_count = 0;
          *(undefined4 *)&p_Var22[2]._vptr__Sp_counted_base = 0;
          *(undefined1 *)((long)&p_Var22[2]._vptr__Sp_counted_base + 4) = 0;
          p_Var22[2]._M_use_count = 0;
          p_Var22[3]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var22[3]._M_use_count = 0;
          p_Var22[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Async_state_impl_00285ed0;
          p_Var23 = (_Result<std::pair<ggml_tensor_*,_bool>_> *)operator_new(0x28);
          std::__future_base::_Result<std::pair<ggml_tensor_*,_bool>_>::_Result(p_Var23);
          p_Var22[4]._vptr__Sp_counted_base = (_func_int **)p_Var23;
          *(undefined4 **)&p_Var22[4]._M_use_count = puVar16;
          p_Var22[5]._vptr__Sp_counted_base = pp_Var29;
          *(_func_int ***)&p_Var22[5]._M_use_count = __new_size;
          local_150[0] = (ggml_backend_buffer *)0x0;
          local_160 = (long *)operator_new(0x20);
          *local_160 = (long)&PTR___State_00285f28;
          local_160[1] = (long)local_100;
          local_160[2] = (long)std::__future_base::
                               _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model-loader.cpp:1008:79)>_>,_std::pair<ggml_tensor_*,_bool>_>
                               ::_M_run;
          local_160[3] = 0;
          std::thread::_M_start_thread(local_150,&local_160,0);
          lVar12 = local_38;
          if (local_160 != (long *)0x0) {
            (**(code **)(*local_160 + 8))();
          }
          if (p_Var22[3]._vptr__Sp_counted_base != (_func_int **)0x0) {
LAB_001b8409:
            std::terminate();
          }
          p_Var22[3]._vptr__Sp_counted_base = (_func_int **)local_150[0];
          local_138._M_dataplus._M_p = (pointer)local_100;
          local_138._M_string_length = (size_type)p_Var22;
          std::__basic_future<std::pair<ggml_tensor_*,_bool>_>::__basic_future
                    (&local_110,(__state_type *)&local_138);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._M_string_length);
          }
          std::
          vector<std::future<std::pair<ggml_tensor*,bool>>,std::allocator<std::future<std::pair<ggml_tensor*,bool>>>>
          ::emplace_back<std::future<std::pair<ggml_tensor*,bool>>>
                    ((vector<std::future<std::pair<ggml_tensor*,bool>>,std::allocator<std::future<std::pair<ggml_tensor*,bool>>>>
                      *)&local_58,(future<std::pair<ggml_tensor_*,_bool>_> *)&local_110);
          if (local_110._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_110._M_state.
                       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
        }
        if (lVar12 == 0) {
          if (*(long *)(puVar16 + 0x3e) == 0) {
            ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model-loader.cpp"
                       ,0x3f5,"GGML_ASSERT(%s) failed","buf_mmap || cur->data");
          }
        }
        else if (*(long *)(puVar16 + 0x3e) == 0) {
          ggml_backend_tensor_alloc(lVar12,puVar16,pp_Var29);
          if (local_70 != (llama_mlocks *)0x0) {
            puVar3 = (local_70->
                     super__Vector_base<std::unique_ptr<llama_mlock,_std::default_delete<llama_mlock>_>,_std::allocator<std::unique_ptr<llama_mlock,_std::default_delete<llama_mlock>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            if ((ulong)((long)(local_70->
                              super__Vector_base<std::unique_ptr<llama_mlock,_std::default_delete<llama_mlock>_>,_std::allocator<std::unique_ptr<llama_mlock,_std::default_delete<llama_mlock>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 3) <=
                (ulong)plVar18->idx) {
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                        );
            }
            llama_mlock::grow_to
                      ((llama_mlock *)
                       puVar3[plVar18->idx]._M_t.
                       super___uniq_ptr_impl<llama_mlock,_std::default_delete<llama_mlock>_>._M_t,
                       plVar18->offs + (long)__new_size);
          }
          uVar1 = plVar18->idx;
          ppVar4 = (this->mmaps_used).
                   super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar28 = plVar18->offs;
          uVar5 = ppVar4[uVar1].second;
          uVar30 = ppVar4[uVar1].first;
          if (uVar28 < ppVar4[uVar1].first) {
            uVar30 = uVar28;
          }
          ppVar4[uVar1].first = uVar30;
          uVar30 = (long)__new_size + uVar28;
          if ((long)__new_size + uVar28 < uVar5) {
            uVar30 = uVar5;
          }
          ppVar4[uVar1].second = uVar30;
          goto LAB_001b7f50;
        }
        ggml_backend_tensor_set(puVar16,pp_Var29,0,__new_size);
      }
      else {
        puVar2 = (this->files).
                 super__Vector_base<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>,_std::allocator<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(this->files).
                          super__Vector_base<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>,_std::allocator<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3) <= uVar28)
        {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar28);
        }
        cVar11 = ggml_backend_buffer_is_host(*(undefined8 *)(puVar16 + 2));
        if (cVar11 == '\0') {
          if ((char)local_13c == '\0') {
            llama_file::seek((llama_file *)
                             puVar2[uVar28]._M_t.
                             super___uniq_ptr_impl<llama_file,_std::default_delete<llama_file>_>.
                             _M_t,plVar18->offs,0);
            if (__new_size != (_func_int **)0x0) {
              pp_Var29 = (_func_int **)0x0;
              do {
                sVar34 = (long)__new_size - (long)pp_Var29;
                if (0xfffff < sVar34) {
                  sVar34 = 0x100000;
                }
                ggml_backend_event_synchronize(local_e8[uVar32]);
                llama_file::read_raw
                          ((llama_file *)
                           puVar2[uVar28]._M_t.
                           super___uniq_ptr_impl<llama_file,_std::default_delete<llama_file>_>._M_t,
                           *(void **)((long)local_a8 + uVar32 * 8),sVar34);
                ggml_backend_tensor_set_async
                          (local_f0,puVar16,*(undefined8 *)((long)local_a8 + uVar32 * 8),pp_Var29,
                           sVar34);
                ggml_backend_event_record(local_e8[uVar32],local_f0);
                pp_Var29 = (_func_int **)((long)pp_Var29 + sVar34);
                uVar32 = (ulong)((int)uVar32 + 1U & 3);
              } while (pp_Var29 < __new_size);
            }
          }
          else {
            std::vector<no_init<unsigned_char>,_std::allocator<no_init<unsigned_char>_>_>::resize
                      (&local_c8,(size_type)__new_size);
            llama_file::seek((llama_file *)
                             puVar2[uVar28]._M_t.
                             super___uniq_ptr_impl<llama_file,_std::default_delete<llama_file>_>.
                             _M_t,plVar18->offs,0);
            llama_file::read_raw
                      ((llama_file *)
                       puVar2[uVar28]._M_t.
                       super___uniq_ptr_impl<llama_file,_std::default_delete<llama_file>_>._M_t,
                       local_c8.
                       super__Vector_base<no_init<unsigned_char>,_std::allocator<no_init<unsigned_char>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,(size_t)__new_size);
            ggml_backend_tensor_set
                      (puVar16,local_c8.
                               super__Vector_base<no_init<unsigned_char>,_std::allocator<no_init<unsigned_char>_>_>
                               ._M_impl.super__Vector_impl_data._M_start,0,__new_size);
            if ((this->check_tensors == true) &&
               (cVar11 = ggml_validate_row_data
                                   (*puVar16,local_c8.
                                             super__Vector_base<no_init<unsigned_char>,_std::allocator<no_init<unsigned_char>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start,__new_size),
               cVar11 == '\0')) {
              prVar25 = (runtime_error *)__cxa_allocate_exception(0x10);
              uVar26 = ggml_get_name(puVar16);
              format_abi_cxx11_(&local_138,"tensor \'%s\' has invalid data",uVar26);
              std::runtime_error::runtime_error(prVar25,(string *)&local_138);
              __cxa_throw(prVar25,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
          }
        }
        else {
          llama_file::seek((llama_file *)
                           puVar2[uVar28]._M_t.
                           super___uniq_ptr_impl<llama_file,_std::default_delete<llama_file>_>._M_t,
                           plVar18->offs,0);
          llama_file::read_raw
                    ((llama_file *)
                     puVar2[uVar28]._M_t.
                     super___uniq_ptr_impl<llama_file,_std::default_delete<llama_file>_>._M_t,
                     *(void **)(puVar16 + 0x3e),(size_t)__new_size);
          if (this->check_tensors == true) {
            local_138._M_dataplus._M_p = (pointer)0x0;
            local_138._M_string_length = 0;
            p_Var22 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x58);
            p_Var22->_M_use_count = 1;
            p_Var22->_M_weak_count = 1;
            p_Var22->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00285f68;
            p_Var22[1]._M_use_count = 0;
            p_Var22[1]._M_weak_count = 0;
            *(undefined4 *)&p_Var22[2]._vptr__Sp_counted_base = 0;
            *(undefined1 *)((long)&p_Var22[2]._vptr__Sp_counted_base + 4) = 0;
            p_Var22[2]._M_use_count = 0;
            p_Var22[3]._vptr__Sp_counted_base = (_func_int **)0x0;
            p_Var22[3]._M_use_count = 0;
            p_Var22[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Async_state_impl_00285fb8;
            p_Var23 = (_Result<std::pair<ggml_tensor_*,_bool>_> *)operator_new(0x28);
            std::__future_base::_Result<std::pair<ggml_tensor_*,_bool>_>::_Result(p_Var23);
            p_Var22[4]._vptr__Sp_counted_base = (_func_int **)p_Var23;
            *(undefined4 **)&p_Var22[4]._M_use_count = puVar16;
            p_Var22[5]._vptr__Sp_counted_base = __new_size;
            local_150[0] = (ggml_backend_buffer *)0x0;
            local_160 = (long *)operator_new(0x20);
            *local_160 = (long)&PTR___State_00286010;
            local_160[1] = (long)(p_Var22 + 1);
            local_160[2] = (long)std::__future_base::
                                 _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model-loader.cpp:1033:83)>_>,_std::pair<ggml_tensor_*,_bool>_>
                                 ::_M_run;
            local_160[3] = 0;
            std::thread::_M_start_thread(local_150,&local_160,0);
            if (local_160 != (long *)0x0) {
              (**(code **)(*local_160 + 8))();
            }
            if (p_Var22[3]._vptr__Sp_counted_base != (_func_int **)0x0) goto LAB_001b8409;
            p_Var22[3]._vptr__Sp_counted_base = (_func_int **)local_150[0];
            local_138._M_dataplus._M_p = (pointer)(p_Var22 + 1);
            local_138._M_string_length = (size_type)p_Var22;
            std::__basic_future<std::pair<ggml_tensor_*,_bool>_>::__basic_future
                      (&local_110,(__state_type *)&local_138);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._M_string_length !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._M_string_length)
              ;
            }
            std::
            vector<std::future<std::pair<ggml_tensor*,bool>>,std::allocator<std::future<std::pair<ggml_tensor*,bool>>>>
            ::emplace_back<std::future<std::pair<ggml_tensor*,bool>>>
                      ((vector<std::future<std::pair<ggml_tensor*,bool>>,std::allocator<std::future<std::pair<ggml_tensor*,bool>>>>
                        *)&local_58,(future<std::pair<ggml_tensor_*,_bool>_> *)&local_110);
            if (local_110._M_state.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_110._M_state.
                         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
          }
        }
      }
LAB_001b7f50:
      this->size_done = this->size_done + (long)__new_size;
    }
    puVar16 = (undefined4 *)ggml_get_next_tensor(local_60);
  }
  for (; puVar8 = puStack_80, lVar12 = local_f0, puVar6 = local_88, puVar33 != puVar7;
      puVar33 = puVar33 + 1) {
    uVar26 = *puVar33;
    ggml_backend_event_synchronize(uVar26);
    ggml_backend_event_free(uVar26);
  }
  for (; puVar6 != puVar8; puVar6 = puVar6 + 1) {
    ggml_backend_buffer_free(*puVar6);
  }
  ggml_backend_free(lVar12);
  pfVar9 = local_58.
           super__Vector_base<std::future<std::pair<ggml_tensor_*,_bool>_>,_std::allocator<std::future<std::pair<ggml_tensor_*,_bool>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_58.
      super__Vector_base<std::future<std::pair<ggml_tensor_*,_bool>_>,_std::allocator<std::future<std::pair<ggml_tensor_*,_bool>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_58.
      super__Vector_base<std::future<std::pair<ggml_tensor_*,_bool>_>,_std::allocator<std::future<std::pair<ggml_tensor_*,_bool>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar10 = false;
    this_01 = local_58.
              super__Vector_base<std::future<std::pair<ggml_tensor_*,_bool>_>,_std::allocator<std::future<std::pair<ggml_tensor_*,_bool>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      while( true ) {
        pVar35 = std::future<std::pair<ggml_tensor_*,_bool>_>::get(this_01);
        if (((undefined1  [16])pVar35 & (undefined1  [16])0x1) != (undefined1  [16])0x0) break;
        uVar26 = ggml_get_name(pVar35.first);
        llama_log_internal(GGML_LOG_LEVEL_ERROR,"%s: tensor \'%s\' has invalid data\n",
                           "load_all_data",uVar26);
        this_01 = this_01 + 1;
        bVar10 = true;
        if (this_01 == pfVar9) goto LAB_001b847b;
      }
      this_01 = this_01 + 1;
    } while (this_01 != pfVar9);
    if (bVar10) {
LAB_001b847b:
      prVar25 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar25,"found tensors with invalid data");
      __cxa_throw(prVar25,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  bVar10 = true;
  if (this->size_data <= this->size_done) {
    if ((this->use_mmap == true) &&
       (puVar31 = (this->mappings).
                  super__Vector_base<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>,_std::allocator<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,
       (this->mappings).
       super__Vector_base<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>,_std::allocator<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish != puVar31)) {
      uVar27 = 1;
      uVar32 = 0;
      do {
        ppVar4 = (this->mmaps_used).
                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(this->mmaps_used).
                          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar4 >> 4) <= uVar32)
        {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar32);
        }
        llama_mmap::unmap_fragment
                  (puVar31[uVar32]._M_t.
                   super___uniq_ptr_impl<llama_mmap,_std::default_delete<llama_mmap>_>._M_t.
                   super__Tuple_impl<0UL,_llama_mmap_*,_std::default_delete<llama_mmap>_>.
                   super__Head_base<0UL,_llama_mmap_*,_false>._M_head_impl,0,ppVar4[uVar32].first);
        sVar34 = ppVar4[uVar32].second;
        if (sVar34 != 0) {
          this_00 = puVar31[uVar32]._M_t.
                    super___uniq_ptr_impl<llama_mmap,_std::default_delete<llama_mmap>_>._M_t.
                    super__Tuple_impl<0UL,_llama_mmap_*,_std::default_delete<llama_mmap>_>.
                    super__Head_base<0UL,_llama_mmap_*,_false>._M_head_impl;
          last = llama_mmap::size(this_00);
          llama_mmap::unmap_fragment(this_00,sVar34,last);
        }
        uVar32 = (ulong)uVar27;
        puVar31 = (this->mappings).
                  super__Vector_base<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>,_std::allocator<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar27 = uVar27 + 1;
      } while (uVar32 < (ulong)((long)(this->mappings).
                                      super__Vector_base<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>,_std::allocator<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar31 >>
                               3));
    }
    if (local_f8 != (llama_progress_callback)0x0) {
      bVar10 = (*local_f8)(1.0,local_68);
    }
  }
LAB_001b8125:
  if (local_a8 != (void *)0x0) {
    operator_delete(local_a8,local_98 - (long)local_a8);
  }
  if (local_e8 != (undefined8 *)0x0) {
    operator_delete(local_e8,local_d8 - (long)local_e8);
  }
  if (local_88 != (undefined8 *)0x0) {
    operator_delete(local_88,local_78 - (long)local_88);
  }
  std::
  vector<std::future<std::pair<ggml_tensor_*,_bool>_>,_std::allocator<std::future<std::pair<ggml_tensor_*,_bool>_>_>_>
  ::~vector(&local_58);
  if (local_c8.super__Vector_base<no_init<unsigned_char>,_std::allocator<no_init<unsigned_char>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.
                    super__Vector_base<no_init<unsigned_char>,_std::allocator<no_init<unsigned_char>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8.
                          super__Vector_base<no_init<unsigned_char>,_std::allocator<no_init<unsigned_char>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.
                          super__Vector_base<no_init<unsigned_char>,_std::allocator<no_init<unsigned_char>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar10;
}

Assistant:

bool llama_model_loader::load_all_data(
        struct ggml_context * ctx,
        llama_buf_map & bufs,
        llama_mlocks * lmlocks,
        llama_progress_callback progress_callback,
        void * progress_callback_user_data) {
    GGML_ASSERT(size_data != 0 && "call init_mappings() first");

    std::vector<no_init<uint8_t>> read_buf;
    std::vector<std::future<std::pair<ggml_tensor *, bool>>> validation_result;

    // 4 staging buffers for async uploads, each sized 1MB seems to be a good default for single NVMe drives.
    // NVMe raid configurations might require more / larger buffers.
    constexpr size_t n_buffers = 4;
    constexpr size_t buffer_size = 1 * 1024 * 1024; // 1MB

    std::vector<ggml_backend_buffer_t> host_buffers;
    std::vector<ggml_backend_event_t> events;
    std::vector<void *> host_ptrs;
    size_t buffer_idx = 0; // buffer to use for async loads
    ggml_backend_t upload_backend = [&](const char * func) -> ggml_backend_t {
        if (use_mmap || check_tensors) {
            return nullptr;
        }
        // When not using mmaped io use async uploads from pinned memory to GPU memory.
        // First determine if the backend supports the necessary features for async uploads.
        auto * buf = bufs.count(0) ? bufs.at(0) : nullptr;
        if (!buf) {
            LLAMA_LOG_DEBUG("%s: no buffer found for async uploads\n", func);
            return nullptr;
        }

        auto * buft = ggml_backend_buffer_get_type(buf);
        auto * dev = ggml_backend_buft_get_device(buft);
        if (!dev) {
            LLAMA_LOG_DEBUG("%s: no device found for buffer type %s for async uploads\n", func,
                ggml_backend_buft_name(buft));
            return nullptr;
        }

        if (buft != ggml_backend_dev_buffer_type(dev)) {
            LLAMA_LOG_DEBUG("%s: buffer type %s is not the default buffer type for device %s for async uploads\n", func,
                ggml_backend_buft_name(buft), ggml_backend_dev_name(dev));
            return nullptr;
        }

        ggml_backend_dev_props props;
        ggml_backend_dev_get_props(dev, &props);
        if (!props.caps.async || !props.caps.host_buffer || !props.caps.events) {
            LLAMA_LOG_DEBUG("%s: device %s does not support async, host buffers or events\n", func,
                ggml_backend_dev_name(dev));
            return nullptr;
        }

        auto * host_buft = ggml_backend_dev_host_buffer_type(dev);
        if (!host_buft) {
            LLAMA_LOG_DEBUG("%s: no host buffer type found for device %s\n", func,
                ggml_backend_dev_name(dev));
            return nullptr;
        }

        // If the backend is supported, create pinned memory buffers and events for synchronisation.
        for (size_t idx = 0; idx < n_buffers; ++idx) {
            auto * buf = ggml_backend_buft_alloc_buffer(host_buft, buffer_size);
            if (!buf) {
                LLAMA_LOG_DEBUG("%s: failed to allocate host buffer for async uploads for device %s\n", func,
                    ggml_backend_dev_name(dev));
                return nullptr;
            }

            host_buffers.emplace_back(buf);
            host_ptrs.emplace_back(ggml_backend_buffer_get_base(buf));

            auto * event = ggml_backend_event_new(dev);
            if (!event) {
                LLAMA_LOG_DEBUG("%s: failed to create event for async uploads for device %s\n", func,
                    ggml_backend_dev_name(dev));
                return nullptr;
            }

            events.emplace_back(event);
        }

        ggml_backend_t backend = ggml_backend_dev_init(dev, nullptr);
        if (!backend) {
            LLAMA_LOG_DEBUG("%s: failed to initialize backend for device %s for async uploads\n", func,
                ggml_backend_dev_name(dev));
            return nullptr;
        }

        return backend;
    }(__func__);

    if (upload_backend) {
        LLAMA_LOG_DEBUG("%s: using async uploads for device %s, buffer type %s, backend %s\n", __func__,
            ggml_backend_dev_name(ggml_backend_get_device(upload_backend)),
            ggml_backend_buft_name(ggml_backend_buffer_get_type(bufs.at(0))),
            ggml_backend_name(upload_backend));
    }

    for (struct ggml_tensor * cur = ggml_get_first_tensor(ctx); cur != NULL; cur = ggml_get_next_tensor(ctx, cur)) {
        const auto * weight = get_weight(ggml_get_name(cur));
        if (weight == nullptr) {
            // this can happen with split experts models
            continue;
        }

        if (progress_callback) {
            if (!progress_callback((float) size_done / size_data, progress_callback_user_data)) {
                return false;
            }
        }

        size_t n_size = ggml_nbytes(cur);

        if (use_mmap) {
            const auto & mapping = mappings.at(weight->idx);
            ggml_backend_buffer_t buf_mmap = nullptr;
            if (bufs.count(weight->idx)) {
                buf_mmap = bufs.at(weight->idx);
            }
            uint8_t * data = (uint8_t *) mapping->addr() + weight->offs;

            if (check_tensors) {
                validation_result.emplace_back(std::async(std::launch::async, [cur, data, n_size] {
                    return std::make_pair(cur, ggml_validate_row_data(cur->type, data, n_size));
                }));
            }

            GGML_ASSERT(buf_mmap || cur->data); // either we have a buffer to allocate the tensor in, or it is already allocated
            if (buf_mmap && cur->data == nullptr) {
                ggml_backend_tensor_alloc(buf_mmap, cur, data);
                if (lmlocks) {
                    const auto & lmlock = lmlocks->at(weight->idx);
                    lmlock->grow_to(weight->offs + n_size);
                }

                auto & mmap_used = mmaps_used[weight->idx];
                mmap_used.first  = std::min(mmap_used.first,  weight->offs);
                mmap_used.second = std::max(mmap_used.second, weight->offs + n_size);
            } else {
                ggml_backend_tensor_set(cur, data, 0, n_size);
            }
        } else {
            const auto & file = files.at(weight->idx);
            if (ggml_backend_buffer_is_host(cur->buffer)) {
                file->seek(weight->offs, SEEK_SET);
                file->read_raw(cur->data, n_size);
                if (check_tensors) {
                    validation_result.emplace_back(std::async(std::launch::async, [cur, n_size] {
                        return std::make_pair(cur, ggml_validate_row_data(cur->type, cur->data, n_size));
                    }));
                }
            } else {
                // If upload_backend is valid load the tensor in chunks to pinned memory and upload the buffers asynchronously to the GPU.
                if (upload_backend) {
                    file->seek(weight->offs, SEEK_SET);

                    size_t bytes_read = 0;

                    while (bytes_read < n_size) {
                        size_t read_iteration = std::min<size_t>(buffer_size, n_size - bytes_read);

                        ggml_backend_event_synchronize(events[buffer_idx]);
                        file->read_raw(host_ptrs[buffer_idx], read_iteration);
                        ggml_backend_tensor_set_async(upload_backend, cur, host_ptrs[buffer_idx], bytes_read, read_iteration);
                        ggml_backend_event_record(events[buffer_idx], upload_backend);

                        bytes_read += read_iteration;
                        ++buffer_idx;
                        buffer_idx %= n_buffers;
                    }
                } else {
                    read_buf.resize(n_size);
                    file->seek(weight->offs, SEEK_SET);
                    file->read_raw(read_buf.data(), n_size);
                    ggml_backend_tensor_set(cur, read_buf.data(), 0, n_size);
                    if (check_tensors && !ggml_validate_row_data(cur->type, read_buf.data(), n_size)) {
                        throw std::runtime_error(format("tensor '%s' has invalid data", ggml_get_name(cur)));
                    }
                }
            }
        }

        size_done += n_size;
    }

    // free temporary resources used for async uploads
    for (auto * event : events) {
        ggml_backend_event_synchronize(event);
        ggml_backend_event_free(event);
    }
    for (auto * buf : host_buffers) {
        ggml_backend_buffer_free(buf);
    }
    ggml_backend_free(upload_backend);

    // check validation results
    bool validation_failed = false;
    for (auto & future : validation_result) {
        auto result = future.get();
        if (!result.second) {
            LLAMA_LOG_ERROR("%s: tensor '%s' has invalid data\n", __func__, ggml_get_name(result.first));
            validation_failed = true;
        }
    }
    if (validation_failed) {
        throw std::runtime_error("found tensors with invalid data");
    }

    // check if this is the last call and do final cleanup
    if (size_done >= size_data) {
        // unmap offloaded tensors and metadata
        if (use_mmap) {
            for (uint32_t idx = 0; idx < mappings.size(); idx++) {
                const auto & mmap_used = mmaps_used.at(idx);
                auto & mapping = mappings.at(idx);
                mapping->unmap_fragment(0, mmap_used.first);
                if (mmap_used.second != 0) {
                    mapping->unmap_fragment(mmap_used.second, mapping->size());
                }
            }
        }
        if (progress_callback) {
            // Even though the model is done loading, we still honor
            // cancellation since we need to free allocations.
            return progress_callback(1.0f, progress_callback_user_data);
        }
    }

    return true;
}